

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

_Bool CrawlNumbers(Lexer *lexer)

{
  bool bVar1;
  char cVar2;
  ushort **ppuVar3;
  char local_1a;
  _Bool inside;
  _Bool isTrailingPeriod;
  char nextChar;
  char currentChar;
  Lexer *lexer_local;
  
  cVar2 = GetCurrentCharacter(lexer);
  local_1a = PeekNextCharacter(lexer);
  ppuVar3 = __ctype_b_loc();
  if ((((*ppuVar3)[(int)cVar2] & 0x800) == 0) && (cVar2 != '.')) {
    lexer_local._7_1_ = false;
  }
  else {
    SetTokenStart(lexer);
    bVar1 = false;
    while( true ) {
      ppuVar3 = __ctype_b_loc();
      if ((((*ppuVar3)[(int)local_1a] & 0x800) == 0) && (local_1a != '.')) break;
      local_1a = PeekNextCharacter(lexer);
      GetNextCharacter(lexer);
      bVar1 = true;
    }
    if (!bVar1) {
      GetNextCharacter(lexer);
    }
    SetTokenEnd(lexer);
    lexer_local._7_1_ = true;
  }
  return lexer_local._7_1_;
}

Assistant:

bool CrawlNumbers(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	bool isTrailingPeriod = currentChar == '.';
	if (isdigit(currentChar) || isTrailingPeriod){
		SetTokenStart(lexer);
		bool inside = false;
		while (true){
			if (!isdigit(nextChar) && nextChar != '.') break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}